

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swab.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_20c4::ByteSwap<double>::Run(ByteSwap<double> *this,istream *input_stream)

{
  bool bVar1;
  int iVar2;
  int address;
  int iVar3;
  uchar tmp;
  double data;
  uchar local_39;
  double local_38;
  
  iVar3 = this->start_offset_ * 8 + this->start_address_;
  if (input_stream == (istream *)&std::cin) {
    iVar2 = 0;
    if (0 < iVar3) {
      iVar2 = iVar3;
    }
    iVar2 = iVar2 + 1;
    do {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) break;
      bVar1 = sptk::ReadStream<unsigned_char>(&local_39,(istream *)&std::cin);
    } while (bVar1);
  }
  else {
    std::istream::seekg(input_stream,(long)iVar3,0);
  }
  iVar2 = std::istream::peek();
  if ((iVar2 != -1) &&
     (((byte)input_stream[*(long *)(*(long *)input_stream + -0x18) + 0x20] & 5) == 0)) {
    iVar2 = this->start_offset_;
    while( true ) {
      if ((this->end_address_ != -1) && (this->end_address_ < iVar3)) {
        return true;
      }
      if ((this->end_offset_ != -1) && (this->end_offset_ < iVar2)) {
        return true;
      }
      bVar1 = sptk::ReadStream<double>(&local_38,input_stream);
      if (!bVar1) {
        return true;
      }
      std::__reverse<unsigned_char*>(&local_38,&stack0xffffffffffffffd0);
      bVar1 = sptk::WriteStream<double>(local_38,(ostream *)&std::cout);
      if (!bVar1) break;
      iVar3 = iVar3 + 8;
      iVar2 = iVar2 + 1;
    }
  }
  return false;
}

Assistant:

bool Run(std::istream* input_stream) const override {
    // Skip data.
    const int data_size(static_cast<int>(sizeof(T)));
    const int skip_size(start_address_ + data_size * start_offset_);
    if (&std::cin == input_stream) {
      unsigned char tmp;
      int i(0);
      while (i < skip_size && sptk::ReadStream(&tmp, input_stream)) {
        ++i;
      }
    } else {
      input_stream->seekg(skip_size);
    }
    const int c(input_stream->peek());
    if (EOF == c || input_stream->fail()) {
      return false;
    }

    // Swap data.
    T data;
    for (int address(skip_size), offset(start_offset_);
         (kMagicNumberForEnd == end_address_ || address <= end_address_) &&
         (kMagicNumberForEnd == end_offset_ || offset <= end_offset_) &&
         sptk::ReadStream(&data, input_stream);
         address += data_size, ++offset) {
      unsigned char* p(reinterpret_cast<unsigned char*>(&data));
      std::reverse(p, p + data_size);
      if (!sptk::WriteStream(data, &std::cout)) {
        return false;
      }
    }

    return true;
  }